

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  int iVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar2;
  int iVar3;
  Descriptor *d_00;
  FieldDescriptor *local_38;
  int local_2c;
  FieldDescriptor *pFStack_28;
  int i_2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Descriptor *d_local;
  
  local_1c = 0;
  _i_1 = fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)d;
  while( true ) {
    iVar1 = local_1c;
    iVar3 = Descriptor::nested_type_count((Descriptor *)fields_local);
    if (iVar3 <= iVar1) break;
    d_00 = Descriptor::nested_type((Descriptor *)fields_local,local_1c);
    ListAllFields(d_00,_i_1);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    iVar3 = Descriptor::extension_count((Descriptor *)fields_local);
    pvVar2 = _i_1;
    if (iVar3 <= iVar1) break;
    pFStack_28 = Descriptor::extension((Descriptor *)fields_local,local_20);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(pvVar2,&stack0xffffffffffffffd8);
    local_20 = local_20 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    iVar3 = Descriptor::field_count((Descriptor *)fields_local);
    pvVar2 = _i_1;
    if (iVar3 <= iVar1) break;
    local_38 = Descriptor::field((Descriptor *)fields_local,local_2c);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(pvVar2,&local_38);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}